

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_prefix(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  char *in_RSI;
  long in_RDI;
  char buf [4608];
  char acStackY_1218 [8];
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  char *in_stack_ffffffffffffee00;
  char *in_stack_ffffffffffffee18;
  
  if (*in_RSI == '\0') {
    if (**(char **)(in_RDI + 0x128) == '\0') {
      send_to_char(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8);
    }
    else {
      send_to_char(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8);
      free_pstring(in_stack_ffffffffffffedf0);
      pcVar1 = palloc_string(in_stack_ffffffffffffee18);
      *(char **)(in_RDI + 0x128) = pcVar1;
    }
  }
  else {
    if (**(char **)(in_RDI + 0x128) == '\0') {
      sprintf(acStackY_1218,"Prefix set to %s.\r\n",in_RSI);
    }
    else {
      sprintf(acStackY_1218,"Prefix changed to %s.\r\n",in_RSI);
      free_pstring(in_stack_ffffffffffffedf0);
    }
    pcVar1 = palloc_string(in_stack_ffffffffffffee18);
    *(char **)(in_RDI + 0x128) = pcVar1;
  }
  return;
}

Assistant:

void do_prefix(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_INPUT_LENGTH];

	if (argument[0] == '\0')
	{
		if (ch->prefix[0] == '\0')
		{
			send_to_char("You have no prefix to clear.\r\n", ch);
			return;
		}

		send_to_char("Prefix removed.\r\n", ch);

		free_pstring(ch->prefix);
		ch->prefix = palloc_string("");

		return;
	}

	if (ch->prefix[0] != '\0')
	{
		sprintf(buf, "Prefix changed to %s.\r\n", argument);
		free_pstring(ch->prefix);
	}
	else
	{
		sprintf(buf, "Prefix set to %s.\r\n", argument);
	}

	ch->prefix = palloc_string(argument);
}